

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodeparser.cpp
# Opt level: O2

void __thiscall
NodeParser::parseDemand
          (NodeParser *this,Node *node,Network *nw,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokens)

{
  pointer pbVar1;
  bool bVar2;
  int iVar3;
  InputError *pIVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_68;
  undefined1 local_48 [8];
  Demand d;
  
  if (0x20 < (ulong)((long)(tokens->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(tokens->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start)) {
    iVar3 = (*(node->super_Element)._vptr_Element[2])(node);
    if (iVar3 == 0) {
      Demand::Demand((Demand *)local_48);
      pbVar1 = (tokens->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      iVar3 = (int)((ulong)((long)(tokens->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) >> 5);
      if (1 < iVar3) {
        bVar2 = Utilities::parseNumber<double>(pbVar1 + 1,(double *)local_48);
        if (!bVar2) {
          pIVar4 = (InputError *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string((string *)&local_68,(string *)(pbVar1 + 1));
          InputError::InputError(pIVar4,6,&local_68);
          __cxa_throw(pIVar4,&InputError::typeinfo,ENerror::~ENerror);
        }
        if (iVar3 != 2) {
          __lhs = pbVar1 + 2;
          bVar2 = std::operator!=(__lhs,"*");
          if (bVar2) {
            d.fullDemand = (double)Network::pattern(nw,__lhs);
            if ((Pattern *)d.fullDemand == (Pattern *)0x0) {
              pIVar4 = (InputError *)__cxa_allocate_exception(0x30);
              std::__cxx11::string::string((string *)&local_68,(string *)__lhs);
              InputError::InputError(pIVar4,5,&local_68);
              __cxa_throw(pIVar4,&InputError::typeinfo,ENerror::~ENerror);
            }
          }
        }
      }
      std::__cxx11::list<Demand,_std::allocator<Demand>_>::push_back
                ((list<Demand,_std::allocator<Demand>_> *)&node[1].super_Element.name.field_2,
                 (value_type *)local_48);
      Demand::~Demand((Demand *)local_48);
    }
  }
  return;
}

Assistant:

void NodeParser::parseDemand(Node* node, Network* nw, vector<string>& tokens)
{
    // ... cast Node to Junction
    if ( tokens.size() < 2 ) return;
    if ( node->type() != Node::JUNCTION ) return;
    Junction* junc = static_cast<Junction*>(node);

    // ... declare a demand object and read its parameters
    Demand d;
    parseDemandData(d, nw, tokens);

    // ... add demand to junction
    //     (demand d passed by value so a copy is being added to demands list)
    junc->demands.push_back(d);
}